

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O3

int dwarf_get_FORM_name(uint val,char **s_out)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = -1;
  if ((int)val < 0x1f01) {
    switch(val) {
    case 1:
      pcVar2 = "DW_FORM_addr";
      break;
    default:
      goto switchD_00176861_caseD_2;
    case 3:
      pcVar2 = "DW_FORM_block2";
      break;
    case 4:
      pcVar2 = "DW_FORM_block4";
      break;
    case 5:
      pcVar2 = "DW_FORM_data2";
      break;
    case 6:
      pcVar2 = "DW_FORM_data4";
      break;
    case 7:
      pcVar2 = "DW_FORM_data8";
      break;
    case 8:
      pcVar2 = "DW_FORM_string";
      break;
    case 9:
      pcVar2 = "DW_FORM_block";
      break;
    case 10:
      pcVar2 = "DW_FORM_block1";
      break;
    case 0xb:
      pcVar2 = "DW_FORM_data1";
      break;
    case 0xc:
      pcVar2 = "DW_FORM_flag";
      break;
    case 0xd:
      pcVar2 = "DW_FORM_sdata";
      break;
    case 0xe:
      pcVar2 = "DW_FORM_strp";
      break;
    case 0xf:
      pcVar2 = "DW_FORM_udata";
      break;
    case 0x10:
      pcVar2 = "DW_FORM_ref_addr";
      break;
    case 0x11:
      pcVar2 = "DW_FORM_ref1";
      break;
    case 0x12:
      pcVar2 = "DW_FORM_ref2";
      break;
    case 0x13:
      pcVar2 = "DW_FORM_ref4";
      break;
    case 0x14:
      pcVar2 = "DW_FORM_ref8";
      break;
    case 0x15:
      pcVar2 = "DW_FORM_ref_udata";
      break;
    case 0x16:
      pcVar2 = "DW_FORM_indirect";
      break;
    case 0x17:
      pcVar2 = "DW_FORM_sec_offset";
      break;
    case 0x18:
      pcVar2 = "DW_FORM_exprloc";
      break;
    case 0x19:
      pcVar2 = "DW_FORM_flag_present";
      break;
    case 0x1a:
      pcVar2 = "DW_FORM_strx";
      break;
    case 0x1b:
      pcVar2 = "DW_FORM_addrx";
      break;
    case 0x1c:
      pcVar2 = "DW_FORM_ref_sup4";
      break;
    case 0x1d:
      pcVar2 = "DW_FORM_strp_sup";
      break;
    case 0x1e:
      pcVar2 = "DW_FORM_data16";
      break;
    case 0x1f:
      pcVar2 = "DW_FORM_line_strp";
      break;
    case 0x20:
      pcVar2 = "DW_FORM_ref_sig8";
      break;
    case 0x21:
      pcVar2 = "DW_FORM_implicit_const";
      break;
    case 0x22:
      pcVar2 = "DW_FORM_loclistx";
      break;
    case 0x23:
      pcVar2 = "DW_FORM_rnglistx";
      break;
    case 0x24:
      pcVar2 = "DW_FORM_ref_sup8";
      break;
    case 0x25:
      pcVar2 = "DW_FORM_strx1";
      break;
    case 0x26:
      pcVar2 = "DW_FORM_strx2";
      break;
    case 0x27:
      pcVar2 = "DW_FORM_strx3";
      break;
    case 0x28:
      pcVar2 = "DW_FORM_strx4";
      break;
    case 0x29:
      pcVar2 = "DW_FORM_addrx1";
      break;
    case 0x2a:
      pcVar2 = "DW_FORM_addrx2";
      break;
    case 0x2b:
      pcVar2 = "DW_FORM_addrx3";
      break;
    case 0x2c:
      pcVar2 = "DW_FORM_addrx4";
    }
  }
  else if ((int)val < 0x1f20) {
    if (val == 0x1f01) {
      pcVar2 = "DW_FORM_GNU_addr_index";
    }
    else {
      if (val != 0x1f02) {
        return -1;
      }
      pcVar2 = "DW_FORM_GNU_str_index";
    }
  }
  else if (val == 0x1f20) {
    pcVar2 = "DW_FORM_GNU_ref_alt";
  }
  else if (val == 0x1f21) {
    pcVar2 = "DW_FORM_GNU_strp_alt";
  }
  else {
    if (val != 0x2001) {
      return -1;
    }
    pcVar2 = "DW_FORM_LLVM_addrx_offset";
  }
  *s_out = pcVar2;
  iVar1 = 0;
switchD_00176861_caseD_2:
  return iVar1;
}

Assistant:

int
dwarf_get_FORM_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_FORM_addr:
        *s_out = "DW_FORM_addr";
        return DW_DLV_OK;
    case DW_FORM_block2:
        *s_out = "DW_FORM_block2";
        return DW_DLV_OK;
    case DW_FORM_block4:
        *s_out = "DW_FORM_block4";
        return DW_DLV_OK;
    case DW_FORM_data2:
        *s_out = "DW_FORM_data2";
        return DW_DLV_OK;
    case DW_FORM_data4:
        *s_out = "DW_FORM_data4";
        return DW_DLV_OK;
    case DW_FORM_data8:
        *s_out = "DW_FORM_data8";
        return DW_DLV_OK;
    case DW_FORM_string:
        *s_out = "DW_FORM_string";
        return DW_DLV_OK;
    case DW_FORM_block:
        *s_out = "DW_FORM_block";
        return DW_DLV_OK;
    case DW_FORM_block1:
        *s_out = "DW_FORM_block1";
        return DW_DLV_OK;
    case DW_FORM_data1:
        *s_out = "DW_FORM_data1";
        return DW_DLV_OK;
    case DW_FORM_flag:
        *s_out = "DW_FORM_flag";
        return DW_DLV_OK;
    case DW_FORM_sdata:
        *s_out = "DW_FORM_sdata";
        return DW_DLV_OK;
    case DW_FORM_strp:
        *s_out = "DW_FORM_strp";
        return DW_DLV_OK;
    case DW_FORM_udata:
        *s_out = "DW_FORM_udata";
        return DW_DLV_OK;
    case DW_FORM_ref_addr:
        *s_out = "DW_FORM_ref_addr";
        return DW_DLV_OK;
    case DW_FORM_ref1:
        *s_out = "DW_FORM_ref1";
        return DW_DLV_OK;
    case DW_FORM_ref2:
        *s_out = "DW_FORM_ref2";
        return DW_DLV_OK;
    case DW_FORM_ref4:
        *s_out = "DW_FORM_ref4";
        return DW_DLV_OK;
    case DW_FORM_ref8:
        *s_out = "DW_FORM_ref8";
        return DW_DLV_OK;
    case DW_FORM_ref_udata:
        *s_out = "DW_FORM_ref_udata";
        return DW_DLV_OK;
    case DW_FORM_indirect:
        *s_out = "DW_FORM_indirect";
        return DW_DLV_OK;
    case DW_FORM_sec_offset:
        *s_out = "DW_FORM_sec_offset";
        return DW_DLV_OK;
    case DW_FORM_exprloc:
        *s_out = "DW_FORM_exprloc";
        return DW_DLV_OK;
    case DW_FORM_flag_present:
        *s_out = "DW_FORM_flag_present";
        return DW_DLV_OK;
    case DW_FORM_strx:
        *s_out = "DW_FORM_strx";
        return DW_DLV_OK;
    case DW_FORM_addrx:
        *s_out = "DW_FORM_addrx";
        return DW_DLV_OK;
    case DW_FORM_ref_sup4:
        *s_out = "DW_FORM_ref_sup4";
        return DW_DLV_OK;
    case DW_FORM_strp_sup:
        *s_out = "DW_FORM_strp_sup";
        return DW_DLV_OK;
    case DW_FORM_data16:
        *s_out = "DW_FORM_data16";
        return DW_DLV_OK;
    case DW_FORM_line_strp:
        *s_out = "DW_FORM_line_strp";
        return DW_DLV_OK;
    case DW_FORM_ref_sig8:
        *s_out = "DW_FORM_ref_sig8";
        return DW_DLV_OK;
    case DW_FORM_implicit_const:
        *s_out = "DW_FORM_implicit_const";
        return DW_DLV_OK;
    case DW_FORM_loclistx:
        *s_out = "DW_FORM_loclistx";
        return DW_DLV_OK;
    case DW_FORM_rnglistx:
        *s_out = "DW_FORM_rnglistx";
        return DW_DLV_OK;
    case DW_FORM_ref_sup8:
        *s_out = "DW_FORM_ref_sup8";
        return DW_DLV_OK;
    case DW_FORM_strx1:
        *s_out = "DW_FORM_strx1";
        return DW_DLV_OK;
    case DW_FORM_strx2:
        *s_out = "DW_FORM_strx2";
        return DW_DLV_OK;
    case DW_FORM_strx3:
        *s_out = "DW_FORM_strx3";
        return DW_DLV_OK;
    case DW_FORM_strx4:
        *s_out = "DW_FORM_strx4";
        return DW_DLV_OK;
    case DW_FORM_addrx1:
        *s_out = "DW_FORM_addrx1";
        return DW_DLV_OK;
    case DW_FORM_addrx2:
        *s_out = "DW_FORM_addrx2";
        return DW_DLV_OK;
    case DW_FORM_addrx3:
        *s_out = "DW_FORM_addrx3";
        return DW_DLV_OK;
    case DW_FORM_addrx4:
        *s_out = "DW_FORM_addrx4";
        return DW_DLV_OK;
    case DW_FORM_GNU_addr_index:
        *s_out = "DW_FORM_GNU_addr_index";
        return DW_DLV_OK;
    case DW_FORM_GNU_str_index:
        *s_out = "DW_FORM_GNU_str_index";
        return DW_DLV_OK;
    case DW_FORM_GNU_ref_alt:
        *s_out = "DW_FORM_GNU_ref_alt";
        return DW_DLV_OK;
    case DW_FORM_GNU_strp_alt:
        *s_out = "DW_FORM_GNU_strp_alt";
        return DW_DLV_OK;
    case DW_FORM_LLVM_addrx_offset:
        *s_out = "DW_FORM_LLVM_addrx_offset";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}